

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicswidget_p.cpp
# Opt level: O1

QPalette __thiscall QGraphicsWidgetPrivate::naturalWidgetPalette(QGraphicsWidgetPrivate *this)

{
  ColorGroup CVar1;
  QPalettePrivate *pQVar2;
  QGraphicsWidget *pQVar3;
  undefined8 extraout_RDX;
  long in_RSI;
  long lVar4;
  long in_FS_OFFSET;
  QPalette QVar5;
  QPalette local_30;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  lVar4 = *(long *)(in_RSI + 0x170) + -0x10;
  if (*(long *)(in_RSI + 0x170) == 0) {
    lVar4 = 0;
  }
  (this->super_QGraphicsItemPrivate)._vptr_QGraphicsItemPrivate =
       (_func_int **)&DAT_aaaaaaaaaaaaaaaa;
  (this->super_QGraphicsItemPrivate).extras.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  QPalette::QPalette((QPalette *)this);
  pQVar3 = QGraphicsItem::parentWidget((QGraphicsItem *)(lVar4 + 0x10));
  if (pQVar3 == (QGraphicsWidget *)0x0) {
    if (*(long *)(in_RSI + 0x88) == 0) goto LAB_0064ec8c;
    QGraphicsScene::palette((QGraphicsScene *)&local_30);
  }
  else {
    QGraphicsWidget::palette((QGraphicsWidget *)&local_30);
  }
  CVar1 = *(ColorGroup *)&(this->super_QGraphicsItemPrivate).extras.d.d;
  *(ColorGroup *)&(this->super_QGraphicsItemPrivate).extras.d.d = local_30.currentGroup;
  pQVar2 = (QPalettePrivate *)(this->super_QGraphicsItemPrivate)._vptr_QGraphicsItemPrivate;
  (this->super_QGraphicsItemPrivate)._vptr_QGraphicsItemPrivate = (_func_int **)local_30.d;
  local_30.d = pQVar2;
  local_30.currentGroup = CVar1;
  QPalette::~QPalette(&local_30);
LAB_0064ec8c:
  QPalette::setResolveMask((ulonglong)this);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    QVar5._8_8_ = extraout_RDX;
    QVar5.d = (QPalettePrivate *)this;
    return QVar5;
  }
  __stack_chk_fail();
}

Assistant:

QPalette QGraphicsWidgetPrivate::naturalWidgetPalette() const
{
    Q_Q(const QGraphicsWidget);
    QPalette palette;
    if (QGraphicsWidget *parent = q->parentWidget()) {
        palette = parent->palette();
    } else if (scene) {
        palette = scene->palette();
    }
    palette.setResolveMask(0);
    return palette;
}